

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findDeclaredFunctions.cpp
# Opt level: O1

void declareFunc(Function *func,Program *program)

{
  Function *this;
  bool isDeclaration;
  Func *this_00;
  Type *type;
  tuple<Expr_*,_std::default_delete<Expr>_> this_01;
  char *pcVar1;
  IntegerType *pIVar2;
  ulong uVar3;
  pointer *__ptr;
  Value *val;
  undefined1 auVar4 [16];
  iterator_range<const_llvm::Argument_*> iVar5;
  iterator_range<const_llvm::Argument_*> iVar6;
  undefined1 auVar7 [16];
  __single_object decl;
  Func *local_78;
  _Head_base<0UL,_Func_*,_false> local_70;
  __uniq_ptr_impl<Expr,_std::default_delete<Expr>_> local_68;
  Program *local_60;
  Function *local_58;
  string local_50;
  
  isDeclaration = (bool)llvm::GlobalValue::isDeclaration();
  this_00 = (Func *)operator_new(0x120);
  local_60 = program;
  Func::Func(this_00,func,program,isDeclaration);
  local_78 = this_00;
  local_58 = func;
  iVar5 = llvm::Function::args(func);
  val = (Value *)iVar5.begin_iterator;
  if (val != (Value *)iVar5.end_iterator) {
    do {
      Func::getVarName_abi_cxx11_(&local_50,local_78);
      type = Program::getType(local_60,*(Type **)val);
      this_01.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
      super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)operator_new(0x38);
      Value::Value((Value *)this_01.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
                            super__Head_base<0UL,_Expr_*,_false>._M_head_impl,&local_50,type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_68._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
      super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
           (tuple<Expr_*,_std::default_delete<Expr>_>)
           (tuple<Expr_*,_std::default_delete<Expr>_>)
           this_01.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
           super__Head_base<0UL,_Expr_*,_false>._M_head_impl;
      Func::createExpr(local_78,val,(unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_68);
      if ((_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)
          local_68._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
          super__Head_base<0UL,_Expr_*,_false>._M_head_impl != (Expr *)0x0) {
        (**(code **)(*(long *)local_68._M_t.
                              super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
                              super__Head_base<0UL,_Expr_*,_false>._M_head_impl + 8))();
      }
      local_68._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
      super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
           (tuple<Expr_*,_std::default_delete<Expr>_>)
           (_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)0x0;
      val = val + 0x28;
    } while (val != (Value *)iVar5.end_iterator);
  }
  this = local_58;
  iVar5 = llvm::Function::args(local_58);
  iVar6 = llvm::Function::args(this);
  if (iVar5.begin_iterator != iVar6.end_iterator) {
    Func::setVarArg(local_78,0xff < *(uint *)(*(long *)(this + 0x18) + 8));
  }
  auVar7 = llvm::Value::getName();
  pcVar1 = auVar7._0_8_;
  if ((0x11 < auVar7._8_8_) &&
     (auVar7[0] = -(*pcVar1 == '_'), auVar7[1] = -(pcVar1[1] == '_'),
     auVar7[2] = -(pcVar1[2] == 'V'), auVar7[3] = -(pcVar1[3] == 'E'),
     auVar7[4] = -(pcVar1[4] == 'R'), auVar7[5] = -(pcVar1[5] == 'I'),
     auVar7[6] = -(pcVar1[6] == 'F'), auVar7[7] = -(pcVar1[7] == 'I'),
     auVar7[8] = -(pcVar1[8] == 'E'), auVar7[9] = -(pcVar1[9] == 'R'),
     auVar7[10] = -(pcVar1[10] == '_'), auVar7[0xb] = -(pcVar1[0xb] == 'n'),
     auVar7[0xc] = -(pcVar1[0xc] == 'o'), auVar7[0xd] = -(pcVar1[0xd] == 'n'),
     auVar7[0xe] = -(pcVar1[0xe] == 'd'), auVar7[0xf] = -(pcVar1[0xf] == 'e'),
     auVar4[0] = -((char)*(undefined2 *)(pcVar1 + 0x10) == 't'),
     auVar4[1] = -((char)((ushort)*(undefined2 *)(pcVar1 + 0x10) >> 8) == '_'), auVar4[2] = 0xff,
     auVar4[3] = 0xff, auVar4[4] = 0xff, auVar4[5] = 0xff, auVar4[6] = 0xff, auVar4[7] = 0xff,
     auVar4[8] = 0xff, auVar4[9] = 0xff, auVar4[10] = 0xff, auVar4[0xb] = 0xff, auVar4[0xc] = 0xff,
     auVar4[0xd] = 0xff, auVar4[0xe] = 0xff, auVar4[0xf] = 0xff, auVar4 = auVar4 & auVar7,
     (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff)) {
    auVar7 = llvm::Value::getName();
    if ((auVar7._8_8_ < 4) || (*(int *)(auVar7._0_8_ + -4 + auVar7._8_8_) != 0x746e695f)) {
      auVar7 = llvm::Value::getName();
      uVar3 = auVar7._8_8_;
      if ((uVar3 < 5) ||
         (*(char *)(auVar7._0_8_ + -1 + uVar3) != 'g' ||
          *(int *)(auVar7._0_8_ + -5 + uVar3) != 0x6e6f6c5f)) {
        auVar7 = llvm::Value::getName();
        uVar3 = auVar7._8_8_;
        if ((uVar3 < 6) ||
           (*(short *)(auVar7._0_8_ + -2 + uVar3) != 0x7472 ||
            *(int *)(auVar7._0_8_ + -6 + uVar3) != 0x6f68735f)) {
          auVar7 = llvm::Value::getName();
          uVar3 = auVar7._8_8_;
          if ((uVar3 < 5) ||
             (*(char *)(auVar7._0_8_ + -1 + uVar3) != 'r' ||
              *(int *)(auVar7._0_8_ + -5 + uVar3) != 0x6168635f)) {
            auVar7 = llvm::Value::getName();
            uVar3 = auVar7._8_8_;
            if ((uVar3 < 6) ||
               (*(short *)(auVar7._0_8_ + -2 + uVar3) != 0x7461 ||
                *(int *)(auVar7._0_8_ + -6 + uVar3) != 0x6f6c665f)) {
              auVar7 = llvm::Value::getName();
              uVar3 = auVar7._8_8_;
              if ((uVar3 < 7) ||
                 (*(int *)(auVar7._0_8_ + -4 + uVar3) != 0x656c6275 ||
                  *(int *)(auVar7._0_8_ + -7 + uVar3) != 0x756f645f)) goto LAB_00159bbe;
            }
          }
        }
      }
    }
    pIVar2 = TypeHandler::setSigned(&local_60->typeHandler,(IntegerType *)local_78->returnType);
    local_78->returnType = &pIVar2->super_Type;
  }
LAB_00159bbe:
  local_70._M_head_impl = local_78;
  local_78 = (Func *)0x0;
  Program::addFunction(local_60,this,(unique_ptr<Func,_std::default_delete<Func>_> *)&local_70);
  if (local_70._M_head_impl != (Func *)0x0) {
    std::default_delete<Func>::operator()((default_delete<Func> *)&local_70,local_70._M_head_impl);
  }
  local_70._M_head_impl = (Func *)0x0;
  if (local_78 != (Func *)0x0) {
    std::default_delete<Func>::operator()((default_delete<Func> *)&local_78,local_78);
  }
  return;
}

Assistant:

static void declareFunc(const llvm::Function* func, Program& program) {
    auto decl = std::make_unique<Func>(func, &program, func->isDeclaration());
    for (const llvm::Value& arg : func->args()) {
        auto argVal = std::make_unique<Value>(decl->getVarName(), program.getType(arg.getType()));
        decl->createExpr(&arg, std::move(argVal));
    }

    if (func->args().begin() != func->args().end()) {
        decl->setVarArg(func->isVarArg());
    }

    // FIXME: a hack for CPAchecker -- do this optional
    if (func->getName().startswith("__VERIFIER_nondet_") &&
        (func->getName().endswith("_int") || 
         func->getName().endswith("_long") || 
         func->getName().endswith("_short") || 
         func->getName().endswith("_char") || 
         func->getName().endswith("_float") ||
         func->getName().endswith("_double"))) {
        decl->returnType = program.typeHandler.setSigned(static_cast<IntegerType*>(decl->returnType));
    }
    program.addFunction(func, std::move(decl));
}